

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O2

void __thiscall
IRBuilderAsmJs::BuildLong3
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot src1RegSlot,RegSlot src2RegSlot)

{
  code *pcVar1;
  bool bVar2;
  ValueType VVar3;
  RegOpnd *src1Opnd;
  RegOpnd *pRVar4;
  RegOpnd *this_00;
  undefined4 *puVar5;
  Instr *instr;
  undefined6 in_register_00000032;
  OpCode OVar6;
  Func *pFVar7;
  
  src1Opnd = BuildSrcOpnd(this,src1RegSlot,TyInt64);
  VVar3 = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&src1Opnd->super_Opnd,VVar3);
  pRVar4 = BuildSrcOpnd(this,src2RegSlot,TyInt64);
  VVar3 = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&pRVar4->super_Opnd,VVar3);
  this_00 = BuildDstOpnd(this,dstRegSlot,TyInt64);
  VVar3 = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&this_00->super_Opnd,VVar3);
  switch((int)CONCAT62(in_register_00000032,newOpcode)) {
  case 0x78:
    pFVar7 = this->m_func;
    OVar6 = Add_I4;
    break;
  case 0x79:
    pFVar7 = this->m_func;
    OVar6 = Sub_I4;
    break;
  case 0x7a:
    pFVar7 = this->m_func;
    OVar6 = Mul_I4;
    break;
  case 0x7c:
    (src1Opnd->super_Opnd).m_type = TyUint64;
    (pRVar4->super_Opnd).m_type = TyUint64;
  case 0x7b:
    pRVar4 = BuildTrapIfZero(this,pRVar4,offset);
    if (newOpcode == Div_Trap_Long) {
      src1Opnd = BuildTrapIfMinIntOverNegOne(this,src1Opnd,pRVar4,offset);
    }
    pFVar7 = this->m_func;
    OVar6 = (newOpcode == Div_Trap_ULong) + Div_I4;
    goto LAB_004bd7ac;
  case 0x7e:
    (src1Opnd->super_Opnd).m_type = TyUint64;
    (pRVar4->super_Opnd).m_type = TyUint64;
  case 0x7d:
    pRVar4 = BuildTrapIfZero(this,pRVar4,offset);
    pFVar7 = this->m_func;
    OVar6 = (newOpcode == Rem_Trap_ULong) + Rem_I4;
LAB_004bd7ac:
    instr = IR::Instr::New(OVar6,&this_00->super_Opnd,&src1Opnd->super_Opnd,&pRVar4->super_Opnd,
                           pFVar7);
    goto LAB_004bd7e0;
  case 0x7f:
    pFVar7 = this->m_func;
    OVar6 = And_I4;
    break;
  case 0x80:
    pFVar7 = this->m_func;
    OVar6 = Or_I4;
    break;
  case 0x81:
    pFVar7 = this->m_func;
    OVar6 = Xor_I4;
    break;
  case 0x82:
    pFVar7 = this->m_func;
    OVar6 = Shl_I4;
    break;
  case 0x83:
    pFVar7 = this->m_func;
    OVar6 = ShrU_I4;
    break;
  case 0x84:
    pFVar7 = this->m_func;
    OVar6 = Shr_I4;
    break;
  case 0x85:
    pFVar7 = this->m_func;
    OVar6 = Rol_I4;
    break;
  case 0x86:
    pFVar7 = this->m_func;
    OVar6 = Ror_I4;
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0xcbb,"((0))","(0)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
    instr = (Instr *)0x0;
    goto LAB_004bd7e0;
  }
  instr = IR::Instr::New(OVar6,&this_00->super_Opnd,&src1Opnd->super_Opnd,&pRVar4->super_Opnd,pFVar7
                        );
LAB_004bd7e0:
  AddInstr(this,instr,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildLong3(Js::OpCodeAsmJs newOpcode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot src1RegSlot, Js::RegSlot src2RegSlot)
{
    IR::RegOpnd * src1Opnd = BuildSrcOpnd(src1RegSlot, TyInt64);
    src1Opnd->SetValueType(ValueType::GetInt(false));

    IR::RegOpnd * src2Opnd = BuildSrcOpnd(src2RegSlot, TyInt64);
    src2Opnd->SetValueType(ValueType::GetInt(false));

    IR::RegOpnd * dstOpnd = BuildDstOpnd(dstRegSlot, TyInt64);
    dstOpnd->SetValueType(ValueType::GetInt(false));

    IR::Instr * instr = nullptr;
    switch (newOpcode)
    {
    case Js::OpCodeAsmJs::Add_Long:
        instr = IR::Instr::New(Js::OpCode::Add_I4, dstOpnd, src1Opnd, src2Opnd, m_func);
        break;

    case Js::OpCodeAsmJs::Sub_Long:
        instr = IR::Instr::New(Js::OpCode::Sub_I4, dstOpnd, src1Opnd, src2Opnd, m_func);
        break;

    case Js::OpCodeAsmJs::Mul_Long:
        instr = IR::Instr::New(Js::OpCode::Mul_I4, dstOpnd, src1Opnd, src2Opnd, m_func);
        break;
    case Js::OpCodeAsmJs::Div_Trap_ULong:
        src1Opnd->SetType(TyUint64);
        src2Opnd->SetType(TyUint64);
        // Fall Through for trap
    case Js::OpCodeAsmJs::Div_Trap_Long:
    {
#ifdef _WIN32
        if (CONFIG_FLAG(WasmMathExFilter))
        {
            // Do not emit traps, but make sure we don't remove the div
            dstOpnd->m_dontDeadStore = true;
        }
        else
#endif
        {
            src2Opnd = BuildTrapIfZero(src2Opnd, offset);
            if (newOpcode == Js::OpCodeAsmJs::Div_Trap_Long)
            {
                src1Opnd = BuildTrapIfMinIntOverNegOne(src1Opnd, src2Opnd, offset);
            }
        }
        Js::OpCode op = newOpcode == Js::OpCodeAsmJs::Div_Trap_ULong ? Js::OpCode::DivU_I4 : Js::OpCode::Div_I4;
        instr = IR::Instr::New(op, dstOpnd, src1Opnd, src2Opnd, m_func);
        break;
    }
    case Js::OpCodeAsmJs::Rem_Trap_ULong:
        src1Opnd->SetType(TyUint64);
        src2Opnd->SetType(TyUint64);
        // Fall Through for trap
    case Js::OpCodeAsmJs::Rem_Trap_Long:
    {
#ifdef _WIN32
        if (CONFIG_FLAG(WasmMathExFilter))
        {
            // Do not emit traps, but make sure we don't remove the rem
            dstOpnd->m_dontDeadStore = true;
        }
        else
#endif
        {
            src2Opnd = BuildTrapIfZero(src2Opnd, offset);
        }
        Js::OpCode op = newOpcode == Js::OpCodeAsmJs::Rem_Trap_ULong ? Js::OpCode::RemU_I4 : Js::OpCode::Rem_I4;
        instr = IR::Instr::New(op, dstOpnd, src1Opnd, src2Opnd, m_func);
        break;
    }
    case Js::OpCodeAsmJs::And_Long:
        instr = IR::Instr::New(Js::OpCode::And_I4, dstOpnd, src1Opnd, src2Opnd, m_func);
        break;
    case Js::OpCodeAsmJs::Or_Long:
        instr = IR::Instr::New(Js::OpCode::Or_I4, dstOpnd, src1Opnd, src2Opnd, m_func);
        break;
    case Js::OpCodeAsmJs::Xor_Long:
        instr = IR::Instr::New(Js::OpCode::Xor_I4, dstOpnd, src1Opnd, src2Opnd, m_func);
        break;
    case Js::OpCodeAsmJs::Shl_Long:
        instr = IR::Instr::New(Js::OpCode::Shl_I4, dstOpnd, src1Opnd, src2Opnd, m_func);
        break;
    case Js::OpCodeAsmJs::Shr_Long:
        instr = IR::Instr::New(Js::OpCode::Shr_I4, dstOpnd, src1Opnd, src2Opnd, m_func);
        break;
    case Js::OpCodeAsmJs::Shr_ULong:
        instr = IR::Instr::New(Js::OpCode::ShrU_I4, dstOpnd, src1Opnd, src2Opnd, m_func);
        break;
    case Js::OpCodeAsmJs::Rol_Long:
        instr = IR::Instr::New(Js::OpCode::Rol_I4, dstOpnd, src1Opnd, src2Opnd, m_func);
        break;
    case Js::OpCodeAsmJs::Ror_Long:
        instr = IR::Instr::New(Js::OpCode::Ror_I4, dstOpnd, src1Opnd, src2Opnd, m_func);
        break;
    default:
        Assume(UNREACHED);
    }
    AddInstr(instr, offset);
}